

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O3

int32_t icu_63::SimpleTimeZone::compareToRule
                  (int8_t month,int8_t monthLen,int8_t prevMonthLen,int8_t dayOfMonth,
                  int8_t dayOfWeek,int32_t millis,int32_t millisDelta,EMode ruleMode,
                  int8_t ruleMonth,int8_t ruleDayOfWeek,int8_t ruleDay,int32_t ruleMillis)

{
  bool bVar1;
  short sVar2;
  char cVar3;
  int iVar4;
  int8_t iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  char cVar9;
  
  uVar6 = millis + millisDelta;
  if ((int)uVar6 < 86400000) {
    uVar7 = uVar6;
    if ((int)uVar6 < 0) {
      do {
        uVar6 = uVar6 + 86400000;
        cVar3 = dayOfMonth + -1;
        uVar7 = (dayOfWeek + 5) * 0x4925;
        dayOfWeek = dayOfWeek + ((char)(uVar7 >> 0x11) - (char)((int)uVar7 >> 0x1f)) * -7 + 6;
        dayOfMonth = cVar3;
        if (cVar3 < '\x01') {
          dayOfMonth = prevMonthLen;
        }
        month = month - (cVar3 < '\x01');
        uVar7 = uVar6;
      } while (86399999 < uVar6);
    }
  }
  else {
    do {
      uVar7 = uVar6 + 0xfad9a400;
      cVar3 = dayOfMonth + '\x01';
      cVar9 = (char)((uint)(dayOfWeek * -0x6d) >> 8) + dayOfWeek;
      dayOfWeek = dayOfWeek + ((cVar9 >> 2) - (cVar9 >> 7)) * -7 + 1;
      dayOfMonth = cVar3;
      if (monthLen < cVar3) {
        dayOfMonth = '\x01';
      }
      month = month + (monthLen < cVar3);
      bVar1 = 0xa4cb7ff < uVar6;
      uVar6 = uVar7;
    } while (bVar1);
  }
  if (ruleMonth <= month) {
    if (ruleMonth < month) {
      return 1;
    }
    iVar5 = monthLen;
    if (ruleDay < monthLen) {
      iVar5 = ruleDay;
    }
    iVar4 = (int)dayOfMonth;
    switch(ruleMode) {
    case DOM_MODE:
      iVar8 = (int)iVar5;
      break;
    case DOW_IN_MONTH_MODE:
      if (iVar5 < '\x01') {
        iVar8 = ((int)dayOfWeek + (int)monthLen + 7) - (ruleDayOfWeek + iVar4);
        sVar2 = (short)((uint)(iVar8 * 0x4925) >> 0x10);
        iVar8 = (int)monthLen + iVar5 * 7 + 7 +
                (int)(short)(((sVar2 >> 1) - (sVar2 >> 0xf)) * 7 - (short)iVar8);
      }
      else {
        iVar8 = (int)(short)(((short)((short)dayOfMonth + (short)~dayOfWeek + (short)ruleDayOfWeek +
                                     7) / 7) * -7 +
                             (short)~dayOfWeek + (short)ruleDayOfWeek + (short)dayOfMonth + 7) +
                iVar5 * 7 + -6;
      }
      break;
    case DOW_GE_DOM_MODE:
      iVar8 = (int)ruleDayOfWeek - ((int)dayOfWeek + (int)iVar5);
      sVar2 = (short)((uint)((iVar8 + iVar4 + 0x31) * 0x4925) >> 0x10);
      iVar8 = (int)(short)((short)iVar8 + (short)dayOfMonth + ((sVar2 >> 1) - (sVar2 >> 0xf)) * -7 +
                          0x31) + (int)iVar5;
      break;
    case DOW_LE_DOM_MODE:
      iVar8 = (((int)iVar5 - (int)ruleDayOfWeek) + (int)dayOfWeek) - iVar4;
      sVar2 = (short)((uint)((iVar8 + 0x31) * 0x4925) >> 0x10);
      iVar8 = (int)iVar5 - (int)(short)(((sVar2 >> 1) - (sVar2 >> 0xf)) * -7 + (short)iVar8 + 0x31);
      break;
    default:
      iVar8 = 0;
    }
    if (iVar8 <= iVar4) {
      if (iVar8 < iVar4) {
        return 1;
      }
      if ((int)uVar7 < ruleMillis) {
        return -1;
      }
      return (uint)(ruleMillis < (int)uVar7);
    }
  }
  return -1;
}

Assistant:

int32_t 
SimpleTimeZone::compareToRule(int8_t month, int8_t monthLen, int8_t prevMonthLen,
                              int8_t dayOfMonth,
                              int8_t dayOfWeek, int32_t millis, int32_t millisDelta,
                              EMode ruleMode, int8_t ruleMonth, int8_t ruleDayOfWeek,
                              int8_t ruleDay, int32_t ruleMillis)
{
    // Make adjustments for startTimeMode and endTimeMode
    millis += millisDelta;
    while (millis >= U_MILLIS_PER_DAY) {
        millis -= U_MILLIS_PER_DAY;
        ++dayOfMonth;
        dayOfWeek = (int8_t)(1 + (dayOfWeek % 7)); // dayOfWeek is one-based
        if (dayOfMonth > monthLen) {
            dayOfMonth = 1;
            /* When incrementing the month, it is desirible to overflow
             * from DECEMBER to DECEMBER+1, since we use the result to
             * compare against a real month. Wraparound of the value
             * leads to bug 4173604. */
            ++month;
        }
    }
    while (millis < 0) {
        millis += U_MILLIS_PER_DAY;
        --dayOfMonth;
        dayOfWeek = (int8_t)(1 + ((dayOfWeek+5) % 7)); // dayOfWeek is one-based
        if (dayOfMonth < 1) {
            dayOfMonth = prevMonthLen;
            --month;
        }
    }

    // first compare months.  If they're different, we don't have to worry about days
    // and times
    if (month < ruleMonth) return -1;
    else if (month > ruleMonth) return 1;

    // calculate the actual day of month for the rule
    int32_t ruleDayOfMonth = 0;

    // Adjust the ruleDay to the monthLen, for non-leap year February 29 rule days.
    if (ruleDay > monthLen) {
        ruleDay = monthLen;
    }

    switch (ruleMode)
    {
    // if the mode is day-of-month, the day of month is given
    case DOM_MODE:
        ruleDayOfMonth = ruleDay;
        break;

    // if the mode is day-of-week-in-month, calculate the day-of-month from it
    case DOW_IN_MONTH_MODE:
        // In this case ruleDay is the day-of-week-in-month (this code is using
        // the dayOfWeek and dayOfMonth parameters to figure out the day-of-week
        // of the first day of the month, so it's trusting that they're really
        // consistent with each other)
        if (ruleDay > 0)
            ruleDayOfMonth = 1 + (ruleDay - 1) * 7 +
                (7 + ruleDayOfWeek - (dayOfWeek - dayOfMonth + 1)) % 7;
        
        // if ruleDay is negative (we assume it's not zero here), we have to do
        // the same calculation figuring backward from the last day of the month.
        else
        {
            // (again, this code is trusting that dayOfWeek and dayOfMonth are
            // consistent with each other here, since we're using them to figure
            // the day of week of the first of the month)
            ruleDayOfMonth = monthLen + (ruleDay + 1) * 7 -
                (7 + (dayOfWeek + monthLen - dayOfMonth) - ruleDayOfWeek) % 7;
        }
        break;

    case DOW_GE_DOM_MODE:
        ruleDayOfMonth = ruleDay +
            (49 + ruleDayOfWeek - ruleDay - dayOfWeek + dayOfMonth) % 7;
        break;

    case DOW_LE_DOM_MODE:
        ruleDayOfMonth = ruleDay -
            (49 - ruleDayOfWeek + ruleDay + dayOfWeek - dayOfMonth) % 7;
        // Note at this point ruleDayOfMonth may be <1, although it will
        // be >=1 for well-formed rules.
        break;
    }

    // now that we have a real day-in-month for the rule, we can compare days...
    if (dayOfMonth < ruleDayOfMonth) return -1;
    else if (dayOfMonth > ruleDayOfMonth) return 1;

    // ...and if they're equal, we compare times
    if (millis < ruleMillis) return -1;
    else if (millis > ruleMillis) return 1;
    else return 0;
}